

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L3_imdct12(float *x,float *dst,float *overlap)

{
  float fVar1;
  float fVar2;
  float sum;
  float ovl;
  int i;
  float si [3];
  float co [3];
  float *overlap_local;
  float *dst_local;
  float *x_local;
  
  drmp3_L3_idct3(-*x,x[6] + x[3],x[0xc] + x[9],si + 1);
  drmp3_L3_idct3(x[0xf],x[0xc] - x[9],x[6] - x[3],&ovl);
  i = i ^ 0x80000000;
  for (sum = 0.0; (int)sum < 3; sum = (float)((int)sum + 1)) {
    fVar1 = overlap[(int)sum];
    fVar2 = si[(long)(int)sum + 1] * drmp3_L3_imdct12::g_twid3[(int)sum + 3] +
            (&ovl)[(int)sum] * drmp3_L3_imdct12::g_twid3[(int)sum];
    overlap[(int)sum] =
         si[(long)(int)sum + 1] * drmp3_L3_imdct12::g_twid3[(int)sum] +
         -((&ovl)[(int)sum] * drmp3_L3_imdct12::g_twid3[(int)sum + 3]);
    dst[(int)sum] =
         fVar1 * drmp3_L3_imdct12::g_twid3[2 - (int)sum] +
         -(fVar2 * drmp3_L3_imdct12::g_twid3[5 - (int)sum]);
    dst[5 - (int)sum] =
         fVar1 * drmp3_L3_imdct12::g_twid3[5 - (int)sum] +
         fVar2 * drmp3_L3_imdct12::g_twid3[2 - (int)sum];
  }
  return;
}

Assistant:

static void drmp3_L3_imdct12(float *x, float *dst, float *overlap)
{
    static const float g_twid3[6] = { 0.79335334f,0.92387953f,0.99144486f, 0.60876143f,0.38268343f,0.13052619f };
    float co[3], si[3];
    int i;

    drmp3_L3_idct3(-x[0], x[6] + x[3], x[12] + x[9], co);
    drmp3_L3_idct3(x[15], x[12] - x[9], x[6] - x[3], si);
    si[1] = -si[1];

    for (i = 0; i < 3; i++)
    {
        float ovl  = overlap[i];
        float sum  = co[i]*g_twid3[3 + i] + si[i]*g_twid3[0 + i];
        overlap[i] = co[i]*g_twid3[0 + i] - si[i]*g_twid3[3 + i];
        dst[i]     = ovl*g_twid3[2 - i] - sum*g_twid3[5 - i];
        dst[5 - i] = ovl*g_twid3[5 - i] + sum*g_twid3[2 - i];
    }
}